

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listmenu.cpp
# Opt level: O3

bool __thiscall DListMenu::MouseEvent(DListMenu *this,int type,int x,int y)

{
  bool bVar1;
  int iVar2;
  FListMenuDescriptor *pFVar3;
  uint x_00;
  FListMenuItem *pFVar4;
  ulong uVar5;
  uint y_00;
  
  x_00 = (x - (screen->super_DSimpleCanvas).super_DCanvas.Width / 2) / CleanXfac + 0xa0;
  y_00 = (y - (screen->super_DSimpleCanvas).super_DCanvas.Height / 2) / CleanYfac + 100;
  pFVar4 = this->mFocusControl;
  if (pFVar4 != (FListMenuItem *)0x0) {
LAB_00309991:
    (*pFVar4->_vptr_FListMenuItem[0xe])(pFVar4,type,(ulong)x_00,(ulong)y_00);
    return true;
  }
  pFVar3 = this->mDesc;
  if ((((pFVar3->mWLeft < 1) || (pFVar3->mWLeft < (int)x_00)) &&
      ((pFVar3->mWRight < 1 || ((int)x_00 < pFVar3->mWRight)))) &&
     ((pFVar3->mItems).super_TArray<FListMenuItem_*,_FListMenuItem_*>.Count != 0)) {
    uVar5 = 0;
    do {
      pFVar4 = (pFVar3->mItems).super_TArray<FListMenuItem_*,_FListMenuItem_*>.Array[uVar5];
      iVar2 = (*pFVar4->_vptr_FListMenuItem[2])(pFVar4,(ulong)x_00,(ulong)y_00);
      pFVar3 = this->mDesc;
      if ((char)iVar2 != '\0') {
        pFVar3->mSelectedItem = (int)uVar5;
        pFVar4 = (pFVar3->mItems).super_TArray<FListMenuItem_*,_FListMenuItem_*>.Array[uVar5];
        goto LAB_00309991;
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < (pFVar3->mItems).super_TArray<FListMenuItem_*,_FListMenuItem_*>.Count);
  }
  pFVar3->mSelectedItem = -1;
  bVar1 = DMenu::MouseEvent(&this->super_DMenu,type,x_00,y_00);
  return bVar1;
}

Assistant:

bool DListMenu::MouseEvent(int type, int x, int y)
{
	int sel = -1;

	// convert x/y from screen to virtual coordinates, according to CleanX/Yfac use in DrawTexture
	x = ((x - (screen->GetWidth() / 2)) / CleanXfac) + 160;
	y = ((y - (screen->GetHeight() / 2)) / CleanYfac) + 100;

	if (mFocusControl != NULL)
	{
		mFocusControl->MouseEvent(type, x, y);
		return true;
	}
	else
	{
		if ((mDesc->mWLeft <= 0 || x > mDesc->mWLeft) &&
			(mDesc->mWRight <= 0 || x < mDesc->mWRight))
		{
			for(unsigned i=0;i<mDesc->mItems.Size(); i++)
			{
				if (mDesc->mItems[i]->CheckCoordinate(x, y))
				{
					if ((int)i != mDesc->mSelectedItem)
					{
						//S_Sound (CHAN_VOICE | CHAN_UI, "menu/cursor", snd_menuvolume, ATTN_NONE);
					}
					mDesc->mSelectedItem = i;
					mDesc->mItems[i]->MouseEvent(type, x, y);
					return true;
				}
			}
		}
	}
	mDesc->mSelectedItem = -1;
	return Super::MouseEvent(type, x, y);
}